

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

uint crnlib::dxt1_block::get_block_colors4(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  int iVar6;
  undefined6 in_register_00000032;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  
  uVar7 = CONCAT62(in_register_00000032,color0);
  uVar5 = CONCAT62(in_register_00000012,color1);
  uVar4 = (uint)uVar7;
  iVar1 = ((uVar4 & 0x1c) >> 2) + (uVar4 & 0x1f) * 8;
  uVar3 = (uint)(uVar7 >> 9) & 3 | (uint)(uVar7 >> 3) & 0xfc;
  iVar6 = (uVar4 >> 0xd) + ((uint)(uVar7 >> 0xb) & 0x1fffff) * 8;
  uVar4 = (uint)uVar5;
  iVar2 = ((uVar4 & 0x1c) >> 2) + (uVar4 & 0x1f) * 8;
  uVar8 = (uint)(uVar5 >> 9) & 3 | (uint)(uVar5 >> 3) & 0xfc;
  iVar9 = (uVar4 >> 0xd) + ((uint)(uVar5 >> 0xb) & 0x1fffff) * 8;
  (pDst->field_0).field_0.r = (uchar)iVar6;
  (pDst->field_0).field_0.g = (uchar)uVar3;
  (pDst->field_0).field_0.b = (uchar)iVar1;
  (pDst->field_0).field_0.a = 0xff;
  pDst[1].field_0.field_0.r = (uchar)iVar9;
  pDst[1].field_0.field_0.g = (uchar)uVar8;
  pDst[1].field_0.field_0.b = (uchar)iVar2;
  pDst[1].field_0.field_0.a = 0xff;
  pDst[2].field_0.field_0.r = (uchar)((uint)((iVar9 + iVar6 * 2) * 0x5556) >> 0x10);
  pDst[2].field_0.field_0.g = (uchar)((uVar8 + uVar3 * 2) * 0x5556 >> 0x10);
  pDst[2].field_0.field_0.b = (uchar)((uint)((iVar2 + iVar1 * 2) * 0x5556) >> 0x10);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0.field_0.r = (uchar)((uint)((iVar6 + iVar9 * 2) * 0x5556) >> 0x10);
  pDst[3].field_0.field_0.g = (uchar)((uVar3 + uVar8 * 2) * 0x5556 >> 0x10);
  pDst[3].field_0.field_0.b = (uchar)((uint)((iVar1 + iVar2 * 2) * 0x5556) >> 0x10);
  pDst[3].field_0.field_0.a = 0xff;
  return 4;
}

Assistant:

uint dxt1_block::get_block_colors4(color_quad_u8* pDst, uint16 color0, uint16 color1)
    {
        color_quad_u8 c0(unpack_color(color0, true));
        color_quad_u8 c1(unpack_color(color1, true));

        pDst[0] = c0;
        pDst[1] = c1;

        // The compiler changes the div3 into a mul by recip+shift.
        pDst[2].set_noclamp_rgba((c0.r * 2 + c1.r) / 3, (c0.g * 2 + c1.g) / 3, (c0.b * 2 + c1.b) / 3, 255U);
        pDst[3].set_noclamp_rgba((c1.r * 2 + c0.r) / 3, (c1.g * 2 + c0.g) / 3, (c1.b * 2 + c0.b) / 3, 255U);

        return 4;
    }